

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O1

vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *
PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
          (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
           *__return_storage_ptr__,uint32_t numPoints,DefaultPRNG *generator,bool isCircle,
          float jitterRadius,Point center)

{
  pointer *ppPVar1;
  uint32_t uVar2;
  iterator __position;
  uint uVar3;
  undefined7 in_register_00000009;
  uint32_t y;
  uint uVar4;
  uint uVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar9;
  Point local_80;
  uint local_74;
  undefined4 local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = center._0_8_;
  local_58._12_4_ = in_XMM1_Dd;
  local_70 = (undefined4)CONCAT71(in_register_00000009,isCircle);
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c = jitterRadius;
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::reserve
            (__return_storage_ptr__,(ulong)numPoints);
  dVar7 = (double)numPoints;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  uVar5 = (uint)(long)dVar7;
  if (uVar5 != 0) {
    fVar8 = (float)((long)dVar7 & 0xffffffff);
    local_48 = (float)local_58._4_4_;
    fStack_44 = (float)local_58._4_4_;
    fStack_40 = (float)local_58._4_4_;
    fStack_3c = (float)local_58._4_4_;
    local_74 = 0;
    do {
      local_68 = (float)local_74 / fVar8;
      uVar4 = 0;
      do {
        local_80._8_4_ = local_80._8_4_ & 0xffffff00;
        local_80.x = 0.0;
        local_80.y = 0.0;
        local_64 = (float)uVar4 / fVar8;
        do {
          do {
            uVar2 = generator->seed_;
            uVar3 = uVar2 * 0x3d84a161;
            generator->seed_ = uVar3;
            fVar9 = (((float)(uVar2 * 0x7f3cf & 0x7fffff | 0x40000000) + -2.0) * 0.5 + 1.0) *
                    local_6c;
            local_5c = ((float)(uVar3 & 0x7fffff | 0x40000000) + -2.0) * 0.5 * 6.2831855;
            fVar6 = cosf(local_5c);
            local_60 = fVar6 * fVar9 + 0.0;
            fVar6 = sinf(local_5c);
            local_80.x = (local_60 - (float)local_58._0_4_) + 0.5 + local_68;
            local_80.y = ((fVar6 * fVar9 + 0.0) - local_48) + 0.5 + local_64;
            local_80.valid_ = true;
          } while (local_80.x < 0.0);
        } while (((1.0 < local_80.y) || (1.0 < local_80.x)) || (local_80.y < 0.0));
        if (((char)local_70 == '\0') ||
           ((local_80.x + -0.5) * (local_80.x + -0.5) + (local_80.y + -0.5) * (local_80.y + -0.5) <=
            0.25)) {
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<PoissonGenerator::Point,std::allocator<PoissonGenerator::Point>>::
            _M_realloc_insert<PoissonGenerator::Point_const&>
                      ((vector<PoissonGenerator::Point,std::allocator<PoissonGenerator::Point>> *)
                       __return_storage_ptr__,__position,&local_80);
          }
          else {
            (__position._M_current)->valid_ = true;
            *(undefined3 *)&(__position._M_current)->field_0x9 = local_80._9_3_;
            (__position._M_current)->x = local_80.x;
            (__position._M_current)->y = local_80.y;
            ppPVar1 = &(__return_storage_ptr__->
                       super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppPVar1 = *ppPVar1 + 1;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar5);
      local_74 = local_74 + 1;
    } while (local_74 != uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point> generateJitteredGridPoints(uint32_t numPoints,
                                              PRNG& generator,
                                              bool isCircle = false,
                                              float jitterRadius = 0.004f,
                                              Point center = Point(0.5f, 0.5f)) {
  std::vector<Point> samplePoints;

  samplePoints.reserve(numPoints);

  const uint32_t gridSize = uint32_t(sqrt(numPoints));

  for (uint32_t x = 0; x != gridSize; x++) {
    for (uint32_t y = 0; y != gridSize; y++) {
      Point p;
      do {
        const Point offs = generateRandomPointAround(Point(0, 0), jitterRadius, generator) - center + Point(0.5f, 0.5f);
        p = Point(float(x) / gridSize, float(y) / gridSize) + offs;
        // generate a new point until it is within the boundaries
      } while (!p.isInRectangle());

      if (isCircle)
        if (!p.isInCircle())
          continue;

      samplePoints.push_back(p);
    }
  }

  return samplePoints;
}